

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O0

int arkode_butcher_order5b
              (sunrealtype *b,sunrealtype *c1,sunrealtype *c2,sunrealtype **A,sunrealtype *c3,int s)

{
  int iVar1;
  sunrealtype *z;
  sunrealtype *z_00;
  sunrealtype **in_RCX;
  sunrealtype *in_RDX;
  sunrealtype *in_RSI;
  sunrealtype *in_RDI;
  sunrealtype *in_R8;
  int in_R9D;
  double dVar2;
  sunrealtype *tmp2;
  sunrealtype *tmp1;
  sunrealtype bccAc;
  double local_40;
  int local_34;
  sunrealtype *local_30;
  sunrealtype **local_28;
  sunrealtype *local_20;
  sunrealtype *local_18;
  sunrealtype *local_10;
  uint local_4;
  
  local_34 = in_R9D;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  z = (sunrealtype *)calloc((long)in_R9D,8);
  z_00 = (sunrealtype *)calloc((long)local_34,8);
  iVar1 = arkode_butcher_vv(local_18,local_20,local_34,z);
  if (iVar1 == 0) {
    iVar1 = arkode_butcher_vv(local_10,z,local_34,z_00);
    if (iVar1 == 0) {
      iVar1 = arkode_butcher_mv(local_28,local_30,local_34,z);
      if (iVar1 == 0) {
        iVar1 = arkode_butcher_dot(z,z_00,local_34,&local_40);
        if (iVar1 == 0) {
          free(z);
          free(z_00);
          dVar2 = sqrt(2.220446049250313e-16);
          local_4 = (uint)(ABS(local_40 - 0.1) <= dVar2);
        }
        else {
          local_4 = 0;
        }
      }
      else {
        free(z);
        free(z_00);
        local_4 = 0;
      }
    }
    else {
      free(z);
      free(z_00);
      local_4 = 0;
    }
  }
  else {
    free(z);
    free(z_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static sunbooleantype arkode_butcher_order5b(sunrealtype* b, sunrealtype* c1,
                                             sunrealtype* c2, sunrealtype** A,
                                             sunrealtype* c3, int s)
{
  sunrealtype bccAc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c1, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(b, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A, c3, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(tmp1, tmp2, s, &bccAc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bccAc - SUN_RCONST(0.1)) > TOL) ? SUNFALSE : SUNTRUE;
}